

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken
          (sysbvm_context_t *context,sysbvm_tuple_t environment)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  
  _Var1 = sysbvm_tuple_isKindOf
                    (context,environment,(context->roots).analysisAndEvaluationEnvironmentType);
  if (!_Var1) {
    sysbvm_error("Expected an analysis and evaluation environment.");
  }
  if (*(long *)(environment + 0x50) == 0) {
    psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).objectType,0);
    *(sysbvm_object_tuple_t **)(environment + 0x50) = psVar2;
  }
  return *(sysbvm_tuple_t *)(environment + 0x50);
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(sysbvm_context_t *context, sysbvm_tuple_t environment)
{
    if(!sysbvm_environment_isAnalysisAndEvaluationEnvironment(context, environment))
        sysbvm_error("Expected an analysis and evaluation environment.");

    sysbvm_analysisAndEvaluationEnvironment_t *environmentObject = (sysbvm_analysisAndEvaluationEnvironment_t*)environment;
    if(!environmentObject->analyzerToken)
        environmentObject->analyzerToken = sysbvm_analyzerToken_create(context);
    return environmentObject->analyzerToken;
}